

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall
arealights::Application::preloadShaderInclude
          (Application *this,char *filepath,string *glslIncludePath)

{
  Writer *this_00;
  GLenum err;
  Writer local_c0;
  string cookTorranceShader;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,filepath,(allocator<char> *)&err);
  fw::loadASCIITextFile(&cookTorranceShader,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  (*glad_glNamedStringARB)
            (0x8dae,(GLint)glslIncludePath->_M_string_length,(glslIncludePath->_M_dataplus)._M_p,
             (GLint)cookTorranceShader._M_string_length,cookTorranceShader._M_dataplus._M_p);
  while( true ) {
    err = (*glad_glGetError)();
    if (err == 0) break;
    local_c0._vptr_Writer = (_func_int **)&PTR__Writer_001ea4f0;
    local_c0.m_level = Error;
    local_c0.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
    ;
    local_c0.m_line = 0xd0;
    local_c0.m_func =
         "void arealights::Application::preloadShaderInclude(const char *, std::string) const";
    local_c0.m_verboseLevel = 0;
    local_c0.m_logger = (Logger *)0x0;
    local_c0.m_proceed = false;
    local_c0.m_messageBuilder.m_logger = (Logger *)0x0;
    local_c0.m_messageBuilder.m_containerLogSeperator = "";
    local_c0.m_dispatchAction = NormalLog;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = el::base::Writer::construct(&local_c0,1,"framework");
    el::base::Writer::operator<<(this_00,&err);
    el::base::Writer::~Writer(&local_c0);
  }
  std::__cxx11::string::~string((string *)&cookTorranceShader);
  return;
}

Assistant:

void Application::preloadShaderInclude(const char *filepath, std::string glslIncludePath) const
{
    auto cookTorranceShader = fw::loadASCIITextFile(filepath);

    glNamedStringARB(
        GL_SHADER_INCLUDE_ARB,
        glslIncludePath.size(),
        glslIncludePath.c_str(),
        cookTorranceShader.size(),
        cookTorranceShader.c_str()
    );

    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }
}